

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  ReflectionSchema *this_00;
  long *plVar1;
  bool bVar2;
  CppType CVar3;
  uint32 uVar4;
  int iVar5;
  MessageLite *pMVar6;
  Message **ppMVar7;
  undefined8 *puVar8;
  Message *pMVar9;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar4 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar6 = ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),field
                        ,factory);
    return (Message *)pMVar6;
  }
  this_00 = &this->schema_;
  uVar4 = ReflectionSchema::GetFieldOffset(this_00,field);
  if (*(long *)(field + 0x60) == 0) {
    SetBit(this,message,field);
  }
  else {
    bVar2 = HasOneofField(this,message,field);
    if (!bVar2) {
      ClearOneof(this,message,*(OneofDescriptor **)(field + 0x60));
      ppMVar7 = MutableField<google::protobuf::Message*>(this,message,field);
      puVar8 = (undefined8 *)ReflectionSchema::GetFieldDefault(this_00,field);
      plVar1 = (long *)*puVar8;
      iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
      pMVar9 = (Message *)(**(code **)(*plVar1 + 0x20))(plVar1,iVar5);
      *ppMVar7 = pMVar9;
      goto LAB_005f30a6;
    }
  }
  ppMVar7 = (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
  pMVar9 = *ppMVar7;
LAB_005f30a6:
  if (pMVar9 == (Message *)0x0) {
    puVar8 = (undefined8 *)ReflectionSchema::GetFieldDefault(this_00,field);
    plVar1 = (long *)*puVar8;
    iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
    pMVar9 = (Message *)(**(code **)(*plVar1 + 0x20))(plVar1,iVar5);
    *ppMVar7 = pMVar9;
  }
  return pMVar9;
}

Assistant:

Message* GeneratedMessageReflection::MutableMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == NULL) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}